

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O1

void NOPLL_Clock(opll_t *chip,int32_t *buffer)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar14;
  uint uVar15;
  uint8_t uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  int16_t iVar8;
  ulong uVar9;
  opll_patch_t *poVar10;
  ushort uVar11;
  ushort uVar12;
  short sVar13;
  ulong uVar16;
  uint8_t uVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  ushort uVar24;
  int16_t iVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  
  *buffer = (int)chip->output_m;
  buffer[1] = (int)chip->output_r;
  uVar22 = chip->cycles;
  uVar9 = (ulong)uVar22;
  if (uVar9 == 0) {
    chip->lfo_am_out = (byte)chip->lfo_am_counter >> 3 & 0xf;
  }
  bVar20 = chip->rm_enable;
  chip->rm_enable = (char)bVar20 >> 1;
  bVar7 = chip->write_mode_address;
  if (((bVar7 & 0x10) != 0) && (chip->write_d_en != '\0')) {
    uVar14 = bVar7 & 0xf;
    if (uVar14 < 0x10) {
      uVar4 = bVar7 & 1;
      switch(uVar14) {
      case 0:
      case 1:
        bVar20 = chip->write_data;
        (chip->patch).multi[uVar4] = bVar20 & 0xf;
        (chip->patch).ksr[uVar4] = bVar20 >> 4 & 1;
        (chip->patch).et[uVar4] = bVar20 >> 5 & 1;
        (chip->patch).vib[uVar4] = bVar20 >> 6 & 1;
        (chip->patch).am[uVar4] = bVar20 >> 7;
        break;
      case 2:
        bVar20 = chip->write_data;
        (chip->patch).ksl[0] = bVar20 >> 6;
        (chip->patch).tl = bVar20 & 0x3f;
        break;
      case 3:
        bVar20 = chip->write_data;
        (chip->patch).ksl[1] = bVar20 >> 6;
        (chip->patch).dc = bVar20 >> 4 & 1;
        (chip->patch).dm = bVar20 >> 3 & 1;
        (chip->patch).fb = bVar20 & 7;
        break;
      case 4:
      case 5:
        bVar20 = chip->write_data;
        (chip->patch).dr[uVar4] = bVar20 & 0xf;
        (chip->patch).ar[uVar4] = bVar20 >> 4;
        break;
      case 6:
      case 7:
        bVar20 = chip->write_data;
        (chip->patch).rr[uVar4] = bVar20 & 0xf;
        (chip->patch).sl[uVar4] = bVar20 >> 4;
        break;
      case 0xe:
        bVar7 = chip->write_data & 0x3f;
        chip->rhythm = bVar7;
        if (chip->chip_type == 1) {
          chip->rhythm = bVar7 | 0x20;
        }
        chip->rm_enable = (chip->rhythm & 0x20) << 2 | bVar20 >> 1;
        break;
      case 0xf:
        chip->testmode = chip->write_data & 0xf;
      }
    }
  }
  uVar4 = chip->rm_select + 1;
  uVar14 = 6;
  if (uVar4 < 6) {
    uVar14 = uVar4;
  }
  chip->rm_select = uVar14;
  if ((uVar22 == 0xb) && (chip->rm_enable < '\0')) {
    chip->rm_select = 0;
  }
  uVar15 = (uVar22 + 1) / 3 & 1;
  uVar14 = ch_offset[uVar9];
  bVar20 = chip->inst[uVar14];
  uVar4 = chip->rm_select;
  if (bVar20 == 0 && 5 < uVar4) {
    poVar10 = &chip->patch;
  }
  else {
    uVar2 = bVar20 - 1;
    if (uVar4 < 6) {
      uVar2 = uVar4 + 0xf;
    }
    poVar10 = chip->patchrom + uVar2;
  }
  if (uVar4 - 1 < 2) {
LAB_0012a2ab:
    uVar17 = bVar20 << 2;
  }
  else {
    if (uVar15 != 0) {
      bVar20 = chip->vol[uVar14];
      goto LAB_0012a2ab;
    }
    uVar17 = poVar10->tl;
  }
  chip->c_tl = uVar17;
  chip->c_adrr[0] = poVar10->ar[uVar15];
  chip->c_adrr[1] = poVar10->dr[uVar15];
  chip->c_adrr[2] = poVar10->rr[uVar15];
  chip->c_et = poVar10->et[uVar15];
  chip->c_ksr = poVar10->ksr[uVar15];
  uVar17 = poVar10->ksl[uVar15];
  chip->c_ksl = uVar17;
  uVar24 = chip->fnum[uVar14];
  chip->c_ksr_freq = (byte)(uVar24 >> 8) | chip->block[uVar14] * '\x02';
  bVar7 = (byte)(uVar24 >> 5);
  chip->c_ksl_freq = bVar7;
  bVar20 = chip->block[uVar14];
  chip->c_ksl_block = bVar20;
  if ((uVar9 / 3 & 1) == 0) {
    bVar26 = true;
    if ((chip->rm_enable & 0x40U) != 0) {
      bVar26 = (uVar22 + 0xf) % 0x12 < 0xc;
    }
  }
  else {
    bVar26 = false;
  }
  uVar24 = chip->ch_out;
  uVar1 = chip->chip_type;
  if (uVar1 == 1) {
    sVar13 = (short)((~(uint)uVar24 & 0xffff) >> 0xf) + uVar24;
    if (!bVar26) {
      sVar13 = 0;
    }
    chip->output_m = sVar13;
    uVar12 = 0;
  }
  else {
    if (uVar22 < 0x12 && (chip->rm_enable & 0x40U) != 0) {
      uVar14 = 0x3063f >> ((byte)uVar22 & 0x1f);
    }
    else {
      uVar14 = 0;
    }
    if ((uVar1 == 4) || (uVar1 == 2)) {
      uVar12 = 0;
      if (bVar26) {
        uVar12 = uVar24;
      }
      chip->output_m = uVar12;
      uVar12 = 0;
      if ((uVar14 & 1) != 0) {
        uVar12 = uVar24;
      }
    }
    else {
      sVar13 = (short)((~(uint)uVar24 & 0xffff) >> 0xf);
      uVar11 = uVar24 + sVar13;
      uVar12 = sVar13 + (char)(uVar24 >> 8);
      uVar24 = uVar12;
      if (bVar26) {
        uVar24 = uVar11;
      }
      chip->output_m = uVar24;
      if ((uVar14 & 1) != 0) {
        uVar12 = uVar11;
      }
    }
  }
  chip->output_r = uVar12;
  chip->pg_phase[((uVar22 + 0x11) / 0x12) * -0x12 + uVar22 + 0x11] =
       chip->pg_inc + chip->pg_phase_next;
  bVar18 = chip->rm_enable;
  bVar26 = true;
  if ((uVar22 - 0xd < 2 & (bVar18 & 0x40) >> 6) == 0) {
    bVar26 = ((ulong)(uVar22 + 3) / 3 & 1) == 0;
  }
  uVar14 = chip->pg_phase[uVar9];
  bVar28 = chip->testmode;
  uVar4 = 0;
  if ((bVar28 & 4) == 0) {
    if (bVar26) {
      bVar6 = (byte)chip->eg_dokon & 1;
    }
    else {
      bVar6 = *(byte *)((long)&chip->eg_dokon + 1) & 0x80;
    }
    uVar4 = 0;
    if (bVar6 == 0) {
      uVar4 = uVar14;
    }
  }
  chip->pg_phase_next = uVar4;
  if (uVar9 == 0x11) {
    if ((char)bVar18 < '\0') {
      chip->rm_tc_bit3 = (byte)(uVar14 >> 0xc) & 1;
      lVar23 = 0x191;
      iVar21 = 0xe;
      goto LAB_0012a54e;
    }
  }
  else if (uVar22 == 0xd) {
    chip->rm_hh_bit2 = (byte)(uVar14 >> 0xb) & 1;
    chip->rm_hh_bit3 = (byte)(uVar14 >> 0xc) & 1;
    chip->rm_hh_bit7 = (byte)(uVar14 >> 0x10) & 1;
    lVar23 = 399;
    iVar21 = 0x11;
LAB_0012a54e:
    chip->eg_state[lVar23 + -0x3d] = (uVar14 >> iVar21 & 1) != 0;
  }
  if ((char)bVar18 < '\0') {
    if (uVar9 == 0x11) {
      uVar14 = (uint)(byte)(chip->rm_tc_bit5 ^ chip->rm_tc_bit3 |
                           chip->rm_hh_bit3 ^ chip->rm_tc_bit5 | chip->rm_hh_bit7 ^ chip->rm_hh_bit2
                           ) << 9 | 0x100;
    }
    else if (uVar22 == 0x10) {
      uVar14 = (chip->rm_noise & 1 ^ (uint)chip->rm_hh_bit8) << 8 | (uint)chip->rm_hh_bit8 << 9;
    }
    else {
      if (uVar22 != 0xd) goto LAB_0012a55e;
      uVar22 = (uint)(byte)(chip->rm_tc_bit5 ^ chip->rm_tc_bit3 |
                           chip->rm_hh_bit3 ^ chip->rm_tc_bit5 | chip->rm_hh_bit7 ^ chip->rm_hh_bit2
                           );
      uVar14 = uVar22 << 9;
      if ((chip->rm_noise & 1) == uVar22) {
        uVar14 = uVar14 | 0x34;
      }
      else {
        uVar14 = uVar14 | 0xd0;
      }
    }
  }
  else {
LAB_0012a55e:
    uVar14 = uVar14 >> 9;
  }
  chip->pg_out = (uint16_t)uVar14;
  if ((-1 < (char)bVar18) || (bVar26 = true, 1 < chip->cycles - 0xf)) {
    bVar26 = ((ulong)(chip->cycles + 1) / 3 & 1) == 0;
  }
  if (((bVar18 & 0x40) == 0) || (bVar27 = true, 1 < chip->cycles - 0xd)) {
    bVar27 = ((ulong)(chip->cycles + 3) / 3 & 1) == 0;
  }
  if ((((bVar18 & 0x40) == 0) || ((chip->cycles & 0xfffffffe) != 0x10)) &&
     (((ulong)chip->cycles / 3 & 1) != 0)) {
    uVar22 = chip->op_mod * 2;
  }
  else {
    uVar22 = 0;
  }
  if ((!bVar27) && (chip->c_fb != '\0')) {
    uVar22 = uVar22 | (int)chip->op_fbsum >> (7 - chip->c_fb & 0x1f);
  }
  bVar6 = (byte)chip->op_exp_s;
  if (chip->eg_silent == '\0') {
    if ((chip->op_neg & 2) != 0) {
      if (bVar26) {
        bVar19 = chip->c_dc;
      }
      else {
        bVar19 = chip->c_dm;
      }
      if ((bVar19 & 4) != 0) goto LAB_0012a68d;
    }
  }
  else {
LAB_0012a68d:
    bVar6 = bVar6 | 0xc;
  }
  uVar24 = chip->op_exp_m >> (bVar6 & 0x1f);
  if (chip->eg_silent == '\0') {
    uVar24 = uVar24 ^ (short)((char)(chip->op_neg << 6) >> 7);
  }
  uVar4 = (uint)chip->eg_out * 0x10 + (uint)chip->op_logsin;
  if (0xffe < uVar4) {
    uVar4 = 0xfff;
  }
  chip->op_exp_m = exprom[uVar4 & 0xff];
  chip->op_exp_s = (uint16_t)(uVar4 >> 8);
  uVar22 = uVar22 + (uVar14 & 0xffff);
  uVar4 = uVar22 & 0x3ff;
  uVar14 = uVar4 ^ 0xff;
  if ((uVar22 >> 8 & 1) == 0) {
    uVar14 = uVar4;
  }
  chip->op_logsin = logsinrom[uVar14 & 0xff];
  chip->op_neg = (byte)(uVar14 >> 9) | chip->op_neg * '\x02';
  uVar22 = chip->cycles;
  uVar9 = (ulong)uVar22;
  uVar14 = (uVar22 + 3) % 9;
  chip->op_fbsum = (int16_t)((uint)((int)chip->op_fb2[uVar14] + (int)chip->op_fb1[uVar14]) >> 1);
  if (!bVar26) {
    uVar14 = uVar22 % 9;
    chip->op_fb2[uVar14] = chip->op_fb1[uVar14];
    chip->op_fb1[uVar14] = uVar24;
  }
  chip->op_mod = uVar24 & 0x1ff;
  uVar14 = (uint)(short)uVar24;
  iVar25 = 0;
  if (uVar1 != 1) {
    iVar25 = 0;
    switch(uVar22) {
    case 2:
      iVar25 = chip->ch_out_hh;
      break;
    case 3:
      iVar25 = chip->ch_out_tm;
      break;
    case 4:
      iVar25 = chip->ch_out_bd;
      break;
    case 8:
      iVar25 = chip->ch_out_sd;
      break;
    case 9:
      iVar25 = chip->ch_out_tc;
    }
    if ((int)uVar22 < 0xf) {
      if (uVar22 == 0) {
        chip->ch_out_sd = (int16_t)(uVar14 >> 3);
      }
      else if (uVar22 == 1) {
        chip->ch_out_tc = (int16_t)(uVar14 >> 3);
      }
    }
    else if (uVar22 == 0x11) {
      chip->ch_out_bd = (int16_t)(uVar14 >> 3);
    }
    else if (uVar22 == 0x10) {
      chip->ch_out_tm = (int16_t)(uVar14 >> 3);
    }
    else if (uVar22 == 0xf) {
      chip->ch_out_hh = (int16_t)(uVar14 >> 3);
    }
  }
  if (-1 < (char)bVar18) {
    iVar25 = 0;
  }
  iVar8 = (int16_t)((int)uVar14 >> 3);
  if (!bVar26) {
    iVar8 = iVar25;
  }
  chip->ch_out = iVar8;
  uVar24 = chip->c_fnum;
  iVar21 = (uint)uVar24 + (uint)uVar24;
  if (chip->c_vib == '\0') goto switchD_0012a827_caseD_4;
  switch(chip->lfo_vib_counter) {
  case '\x01':
  case '\x03':
    uVar24 = uVar24 >> 7;
    break;
  case '\x02':
    uVar24 = uVar24 >> 6;
    break;
  default:
    goto switchD_0012a827_caseD_4;
  case '\x05':
  case '\a':
    uVar24 = uVar24 >> 7;
    goto LAB_0012a8ea;
  case '\x06':
    uVar24 = uVar24 >> 6;
LAB_0012a8ea:
    iVar21 = iVar21 - (uint)uVar24;
    goto switchD_0012a827_caseD_4;
  }
  iVar21 = iVar21 + (uint)uVar24;
switchD_0012a827_caseD_4:
  chip->pg_inc = ((uint)(iVar21 << ((byte)chip->c_block & 0x1f)) >> 1) * pg_multi[chip->c_multi] >>
                 1;
  uVar14 = (uint)chip->eg_ksltl + (uint)chip->eg_level[(uVar22 + 0x11) % 0x12];
  if (chip->c_am != '\0') {
    uVar14 = uVar14 + chip->lfo_am_out;
  }
  uVar3 = '\x7f';
  if (uVar14 < 0x7f) {
    uVar3 = (uint8_t)uVar14;
  }
  uVar14 = 0;
  if ((bVar28 & 1) != 0) {
    uVar3 = '\0';
  }
  chip->eg_out = uVar3;
  sVar13 = 0;
  if (uVar17 != '\0') {
    iVar5 = eg_ksltable[bVar7] + (uint)bVar20 * 8 + -0x40;
    iVar21 = 0;
    if (0 < iVar5) {
      iVar21 = iVar5;
    }
    sVar13 = (short)(iVar21 * 2 >> (3 - uVar17 & 0x1f));
  }
  chip->eg_ksltl = sVar13 + (ushort)chip->c_tl * 2;
  bVar20 = chip->eg_counter_state;
  bVar7 = bVar20 & 3;
  if (bVar7 == 3) {
    if (uVar9 == 0) {
      uVar14 = 1;
    }
    else {
      uVar14 = (uint)chip->eg_timer_carry;
    }
  }
  uVar4 = chip->eg_timer;
  uVar14 = (uVar4 & 1) + uVar14;
  chip->eg_timer_carry = (byte)uVar14 >> 1;
  uVar14 = (uVar14 & 1) << 0x11;
  chip->eg_timer = uVar4 >> 1 | uVar14;
  if ((bVar28 & 8) != 0) {
    uVar15._0_1_ = chip->write_data;
    uVar15._1_1_ = chip->write_a;
    uVar15._2_1_ = chip->write_d;
    uVar15._3_1_ = chip->write_a_en;
    chip->eg_timer = (uVar15 & 4) << 0xe | uVar4 >> 1 & 0x2ffff | uVar14;
  }
  if ((chip->eg_timer_shift_stop == 0) && ((chip->eg_timer & 0x10000) != 0)) {
    chip->eg_timer_shift = (uint8_t)uVar22;
  }
  if ((uVar9 == 0) && ((chip->eg_counter_state_prev & 1) != 0)) {
    chip->eg_timer_low_lock = (byte)uVar4 & 3;
    bVar18 = 0;
    if (chip->eg_timer_shift < 0xe) {
      bVar18 = chip->eg_timer_shift;
    }
    chip->eg_timer_shift_lock = bVar18;
    chip->eg_timer_shift = '\0';
  }
  bVar18 = *(byte *)((long)&chip->eg_timer + 2) & 1 | chip->eg_timer_shift_stop;
  if (uVar9 == 0) {
    bVar18 = 0;
  }
  chip->eg_timer_shift_stop = bVar18;
  chip->eg_counter_state_prev = bVar20;
  if (uVar9 == 0x11) {
    chip->eg_counter_state = bVar20 + 1;
  }
  uVar14 = (uVar22 + 0x10) % 0x12;
  bVar18 = chip->eg_level[uVar14];
  chip->eg_silent = bVar18 == 0x7f;
  bVar28 = chip->eg_state[uVar14];
  bVar6 = bVar18;
  if (((bVar28 != 0) && ((chip->eg_off & 2) != 0)) && (bVar6 = 0x7f, (chip->eg_dokon & 2) != 0)) {
    bVar6 = bVar18;
  }
  if ((chip->eg_maxrate != '\0') && ((chip->eg_dokon & 2) != 0)) {
    bVar6 = 0;
  }
  bVar19 = 0;
  if (bVar28 - 2 < 2) {
    if (((chip->eg_off & 2) == 0) && ((chip->eg_dokon & 2) == 0)) {
      uVar17 = chip->eg_rate_hi;
      if (uVar17 == '\x0f') {
        bVar19 = 2;
      }
      else {
        bVar19 = 0;
        if (uVar17 == '\x0e') {
          bVar19 = (chip->eg_inc_hi != '\0') * '\x02';
        }
      }
      if (uVar17 == '\f') {
        bVar18 = bVar7 == 3;
        if (chip->eg_inc_hi != '\0') {
          bVar18 = bVar20;
        }
        bVar26 = true;
        if ((bVar18 & 1) == 0) goto LAB_0012acb4;
      }
      else if (uVar17 == '\r') {
        bVar26 = true;
        if ((bVar20 & 1) == 0 && chip->eg_inc_hi == '\0') goto LAB_0012acb4;
      }
      else if ((uVar17 == '\x0e') && (chip->eg_inc_hi == '\0')) {
        bVar26 = true;
      }
      else {
LAB_0012acb4:
        bVar26 = chip->eg_inc_lo != '\0' && bVar7 == 3;
      }
      bVar19 = bVar26 | bVar19;
    }
  }
  else if (bVar28 == 1) {
    bVar19 = 0;
    if ((((chip->eg_off & 2) == 0) && (bVar19 = 0, (chip->eg_dokon & 2) == 0)) &&
       ((ushort)(bVar18 >> 3) != chip->eg_sl)) {
      uVar17 = chip->eg_rate_hi;
      if (uVar17 == '\x0f') {
        bVar19 = 2;
      }
      else {
        bVar19 = 0;
        if (uVar17 == '\x0e') {
          bVar19 = (chip->eg_inc_hi != '\0') * '\x02';
        }
      }
      if (uVar17 == '\f') {
        bVar28 = bVar7 == 3;
        if (chip->eg_inc_hi != '\0') {
          bVar28 = bVar20;
        }
        bVar26 = true;
        if ((bVar28 & 1) == 0) goto LAB_0012ad59;
      }
      else if (uVar17 == '\r') {
        bVar26 = true;
        if ((bVar20 & 1) == 0 && chip->eg_inc_hi == '\0') goto LAB_0012ad59;
      }
      else if ((uVar17 == '\x0e') && (chip->eg_inc_hi == '\0')) {
        bVar26 = true;
      }
      else {
LAB_0012ad59:
        bVar26 = chip->eg_inc_lo != '\0' && bVar7 == 3;
      }
      bVar19 = bVar26 | bVar19;
    }
    bVar28 = ((ushort)(bVar18 >> 3) == chip->eg_sl) + 1;
  }
  else {
    bVar26 = bVar28 == 0;
    bVar28 = 0;
    bVar19 = 0;
    if (bVar26) {
      bVar19 = 0;
      if (((chip->eg_maxrate == '\0') && (bVar19 = 0, (chip->eg_kon & 2) != 0)) && (bVar18 != 0)) {
        if (chip->eg_rate_hi < 0xc) {
          uVar4 = (uint)chip->eg_inc_lo;
        }
        else {
          uVar4 = ((uint)chip->eg_rate_hi + (uint)chip->eg_inc_hi) - 0xb;
        }
        bVar19 = ~(bVar18 >> (5U - (char)uVar4 & 0x1f));
        if ((int)uVar4 < 1) {
          bVar19 = 0;
        }
      }
      bVar28 = bVar18 == 0;
    }
  }
  bVar20 = chip->eg_kon;
  bVar7 = 3;
  if ((bVar20 & 2) != 0) {
    bVar7 = bVar28;
  }
  uVar4 = chip->eg_dokon;
  bVar18 = 0;
  if ((uVar4 & 2) == 0) {
    bVar18 = bVar7;
  }
  chip->eg_level[uVar14] = bVar19 + bVar6;
  chip->eg_state[uVar14] = bVar18;
  bVar7 = chip->eg_rate;
  bVar18 = bVar7 >> 2;
  chip->eg_inc_hi =
       *(uint8_t *)
        ((long)eg_stephi[0] + (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar7 & 3) << 4));
  chip->eg_inc_lo = '\0';
  if ((bVar7 < 0x30) && (chip->eg_zerorate == '\0')) {
    bVar28 = chip->eg_timer_shift_lock + bVar18 & 0xf;
    if (bVar28 == 0xc) {
      bVar7 = 1;
    }
    else {
      if (bVar28 != 0xe) {
        if (bVar28 != 0xd) goto LAB_0012ae18;
        bVar7 = bVar7 >> 1;
      }
      bVar7 = bVar7 & 1;
    }
    chip->eg_inc_lo = bVar7;
  }
LAB_0012ae18:
  chip->eg_maxrate = bVar18 == 0xf;
  chip->eg_rate_hi = bVar18;
  bVar20 = bVar20 * '\x02';
  chip->eg_kon = bVar20;
  uVar14 = ch_offset[uVar9];
  bVar20 = bVar20 | chip->kon[uVar14];
  chip->eg_kon = bVar20;
  bVar7 = chip->eg_off * '\x02';
  chip->eg_off = bVar7;
  bVar18 = chip->eg_level[uVar9] & 0xfc;
  chip->eg_off = bVar18 == 0x7c | bVar7;
  uVar15 = chip->rm_select;
  switch(uVar15) {
  case 0:
  case 3:
    bVar7 = chip->rhythm >> 4;
    break;
  case 1:
    bVar7 = chip->rhythm;
    break;
  case 2:
    bVar7 = chip->rhythm >> 2;
    break;
  case 4:
    bVar7 = chip->rhythm >> 3;
    break;
  case 5:
    bVar7 = chip->rhythm >> 1;
    break;
  default:
    goto switchD_0012ae76_default;
  }
  chip->eg_kon = bVar7 & 1 | bVar20;
switchD_0012ae76_default:
  uVar16 = (ulong)(uVar22 + 1) / 3;
  uVar4 = uVar4 * 2;
  chip->eg_dokon = uVar4;
  uVar17 = chip->eg_state[uVar9];
  if (((uVar17 == '\x03') && ((chip->eg_kon & 1) != 0)) && (bVar18 == 0x7c)) {
    chip->eg_dokon = uVar4 | 1;
    uVar17 = '\0';
  }
  switch(uVar17) {
  case '\0':
    uVar17 = chip->c_adrr[0];
    break;
  case '\x01':
    uVar17 = chip->c_adrr[1];
    break;
  case '\x02':
    if (chip->c_et != '\0') goto switchD_0012aefa_default;
LAB_0012af1e:
    uVar17 = chip->c_adrr[2];
    break;
  case '\x03':
    uVar17 = '\x05';
    if (chip->son[uVar14] == '\0') goto LAB_0012af1e;
    break;
  default:
switchD_0012aefa_default:
    uVar17 = '\0';
  }
  bVar20 = chip->eg_kon;
  uVar3 = '\0';
  if ((bVar20 & 1) != 0) {
    uVar3 = uVar17;
  }
  if (uVar15 - 1 < 2) {
    uVar3 = uVar17;
  }
  if ((uVar16 & 1) != 0) {
    uVar3 = uVar17;
  }
  uVar17 = uVar3;
  if ((bVar20 & 1) != 0) {
    uVar17 = '\f';
    if (bVar18 == 0x7c) {
      uVar17 = uVar3;
    }
    if (chip->eg_state[uVar9] != '\x03') {
      uVar17 = uVar3;
    }
  }
  uVar3 = uVar17;
  if ((((bVar20 & 1) == 0) && ((uVar16 & 1) != 0)) &&
     ((chip->son[uVar14] == '\0' && (uVar3 = '\a', chip->c_et != '\0')))) {
    uVar3 = uVar17;
  }
  chip->eg_zerorate = uVar3 == '\0';
  bVar20 = chip->c_ksr_freq >> 2;
  if (chip->c_ksr != '\0') {
    bVar20 = chip->c_ksr_freq;
  }
  bVar7 = uVar3 * '\x04' + bVar20;
  bVar20 = bVar20 & 3 | 0x3c;
  if ((bVar7 & 0x40) == 0) {
    bVar20 = bVar7;
  }
  chip->eg_rate = bVar20;
  chip->eg_sl = (ushort)chip->c_sl;
  uVar22 = chip->cycles;
  uVar9 = (ulong)uVar22;
  if (uVar9 == 0x11) {
    uVar24 = chip->lfo_counter;
    chip->lfo_am_step = (uint8_t)((uVar24 & 0x3f) + 1 >> 6);
    chip->lfo_vib_counter =
         ((byte)((uVar24 & 0x3ff) + 1 >> 10) | chip->testmode >> 3 & 1) + chip->lfo_vib_counter & 7;
    chip->lfo_counter = uVar24 + 1;
  }
  if (chip->lfo_am_step == '\0') {
    bVar20 = 0;
    if ((uVar22 < 9) && ((chip->testmode & 8) != 0)) goto LAB_0012b060;
  }
  else if (uVar22 < 9) {
LAB_0012b060:
    bVar20 = uVar9 == 0 | chip->lfo_am_dir;
  }
  else {
    bVar20 = 0;
  }
  if (8 < uVar22) {
    chip->lfo_am_car = '\0';
  }
  if (uVar9 == 0) {
    if (chip->lfo_am_dir == '\0') {
      uVar17 = '\x01';
      if ((~chip->lfo_am_counter & 0x69) != 0) goto LAB_0012b0ae;
    }
    else {
      if ((chip->lfo_am_counter & 0x7f) != 0) goto LAB_0012b0ae;
      uVar17 = '\0';
    }
    chip->lfo_am_dir = uVar17;
  }
LAB_0012b0ae:
  bVar20 = bVar20 + chip->lfo_am_car + ((byte)chip->lfo_am_counter & 1);
  chip->lfo_am_car = bVar20 >> 1;
  uVar24 = chip->lfo_am_counter >> 1;
  chip->lfo_am_counter = (ushort)(bVar20 & 1) << 8 | uVar24;
  if ((chip->testmode & 2) != 0) {
    chip->lfo_vib_counter = '\0';
    chip->lfo_counter = 0;
    chip->lfo_am_dir = '\0';
    chip->lfo_am_counter = uVar24 & 0xff;
  }
  uVar14 = chip->rm_noise;
  chip->rm_noise =
       uVar14 >> 1 |
       (uint)(((byte)(uVar14 >> 0xe) ^ (byte)uVar14 | chip->testmode >> 1) & 1 | uVar14 == 0) <<
       0x16;
  uVar14 = ch_offset[uVar9];
  if ((uVar15 < 6) || (chip->inst[uVar14] != 0)) {
    uVar4 = chip->inst[uVar14] - 1;
    if (uVar15 < 6) {
      uVar4 = uVar15 + 0xf;
    }
    poVar10 = chip->patchrom + uVar4;
  }
  else {
    poVar10 = &chip->patch;
  }
  chip->c_fnum = chip->fnum[uVar14];
  chip->c_block = (ushort)chip->block[uVar14];
  bVar26 = ((ulong)(uVar22 + 1) / 3 & 1) != 0;
  chip->c_multi = poVar10->multi[bVar26];
  chip->c_sl = poVar10->sl[bVar26];
  chip->c_fb = poVar10->fb;
  chip->c_vib = poVar10->vib[bVar26];
  chip->c_am = poVar10->am[bVar26];
  bVar20 = chip->c_dc * '\x02';
  chip->c_dc = bVar20;
  bVar7 = chip->c_dm * '\x02';
  chip->c_dm = bVar7;
  chip->c_dc = bVar20 | poVar10->dc;
  chip->c_dm = bVar7 | poVar10->dm;
  uVar17 = chip->write_a_en;
  if (uVar17 != '\0') {
    if (chip->write_data < 0x40) {
      chip->write_fm_address = '\x01';
      chip->address = chip->write_data;
    }
    else {
      chip->write_fm_address = '\0';
    }
  }
  uVar3 = chip->write_fm_address;
  if ((uVar3 != '\0') && (chip->write_d_en != '\0')) {
    chip->data = chip->write_data;
  }
  if (((uVar17 == '\0') && (chip->write_fm_data != '\0')) && (uVar22 == (chip->address & 0xf))) {
    uVar14 = uVar22 % 9;
    uVar4 = chip->address & 0xfffffff0;
    if (uVar4 == 0x30) {
      bVar20 = chip->data;
      chip->vol[uVar14] = bVar20 & 0xf;
      chip->inst[uVar14] = bVar20 >> 4;
    }
    else if (uVar4 == 0x20) {
      bVar20 = chip->data;
      if (chip->chip_type == 5) {
        chip->fnum[uVar14] = bVar20 & 0xf | chip->fnum[uVar14] & 0x1f0;
      }
      else {
        chip->fnum[uVar14] = (ushort)(bVar20 & 1) << 8 | chip->fnum[uVar14] & 0xff;
        chip->block[uVar14] = bVar20 >> 1 & 7;
      }
      bVar20 = chip->data;
      chip->kon[uVar14] = bVar20 >> 4 & 1;
      chip->son[uVar14] = bVar20 >> 5 & 1;
    }
    else if (uVar4 == 0x10) {
      bVar20 = chip->data;
      if (chip->chip_type == 5) {
        chip->fnum[uVar14] = (bVar20 & 0x1f) << 4 | chip->fnum[uVar14] & 0xf;
        chip->block[uVar14] = bVar20 >> 5;
      }
      else {
        chip->fnum[uVar14] = chip->fnum[uVar14] & 0x100 | (ushort)bVar20;
      }
    }
  }
  if (uVar17 != '\0') {
    chip->write_fm_data = '\0';
  }
  if ((uVar3 != '\0') && (chip->write_d_en != '\0')) {
    chip->write_fm_data = '\x01';
  }
  if (uVar17 != '\0') {
    bVar20 = chip->write_data | 0x10;
    if (0xf < chip->write_data) {
      bVar20 = 0;
    }
    chip->write_mode_address = bVar20;
  }
  chip->write_a_en = (chip->write_a & 3) == 1;
  chip->write_d_en = (chip->write_d & 3) == 1;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  chip->cycles = (uVar22 + 1) % 0x12;
  return;
}

Assistant:

void NOPLL_Clock(opll_t *chip, int32_t *buffer) {
    buffer[0] = chip->output_m;
    buffer[1] = chip->output_r;
    if (chip->cycles == 0) {
        chip->lfo_am_out = (chip->lfo_am_counter >> 3) & 0x0f;
    }
    chip->rm_enable >>= 1;
    OPLL_DoModeWrite(chip);
    chip->rm_select++;
    if (chip->rm_select > rm_num_tc) {
        chip->rm_select = rm_num_tc + 1;
    }
    if (chip->cycles == 11 && (chip->rm_enable & 0x80) == 0x80) {
        chip->rm_select = rm_num_bd0;
    }
    OPLL_PreparePatch1(chip);

    OPLL_Channel(chip);

    OPLL_PhaseGenerate(chip);

    OPLL_Operator(chip);

    OPLL_PhaseCalcIncrement(chip);

    OPLL_EnvelopeOutput(chip);
    OPLL_EnvelopeKSLTL(chip);
    OPLL_EnvelopeGenerate(chip);

    OPLL_DoLFO(chip);
    OPLL_DoRhythm(chip);
    OPLL_PreparePatch2(chip);
    OPLL_DoRegWrite(chip);
    OPLL_DoIO(chip);
    chip->cycles = (chip->cycles + 1) % 18;

}